

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *ip_00;
  socket_t sVar5;
  const_iterator cVar6;
  string ip;
  char *local_90;
  undefined8 local_88;
  char local_80 [16];
  function<void_(int)> local_70;
  function<void_(int)> local_50;
  
  if (((this->proxy_host_)._M_string_length == 0) || (iVar2 = this->proxy_port_, iVar2 == -1)) {
    local_90 = local_80;
    local_88 = 0;
    local_80[0] = '\0';
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->addr_map_)._M_t,&this->host_);
    if ((_Rb_tree_header *)cVar6._M_node != &(this->addr_map_)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)&local_90);
    }
    ip_00 = local_90;
    pcVar4 = (this->host_)._M_dataplus._M_p;
    iVar2 = this->port_;
    iVar3 = this->address_family_;
    bVar1 = this->tcp_nodelay_;
    std::function<void_(int)>::function(&local_70,&this->socket_options_);
    sVar5 = detail::create_client_socket
                      (pcVar4,ip_00,iVar2,iVar3,bVar1,&local_70,this->connection_timeout_sec_,
                       this->connection_timeout_usec_,this->read_timeout_sec_,
                       this->read_timeout_usec_,this->write_timeout_sec_,this->write_timeout_usec_,
                       &this->interface_,error);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    pcVar4 = (this->proxy_host_)._M_dataplus._M_p;
    iVar3 = this->address_family_;
    bVar1 = this->tcp_nodelay_;
    std::function<void_(int)>::function(&local_50,&this->socket_options_);
    sVar5 = detail::create_client_socket
                      (pcVar4,"",iVar2,iVar3,bVar1,&local_50,this->connection_timeout_sec_,
                       this->connection_timeout_usec_,this->read_timeout_sec_,
                       this->read_timeout_usec_,this->write_timeout_sec_,this->write_timeout_usec_,
                       &this->interface_,error);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
  }
  return sVar5;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error &error) const {
  if (!proxy_host_.empty() && proxy_port_ != -1) {
    return detail::create_client_socket(
        proxy_host_.c_str(), "", proxy_port_, address_family_, tcp_nodelay_,
        socket_options_, connection_timeout_sec_, connection_timeout_usec_,
        read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
        write_timeout_usec_, interface_, error);
  }

  // Check is custom IP specified for host_
  std::string ip;
  auto it = addr_map_.find(host_);
  if (it != addr_map_.end()) ip = it->second;

  return detail::create_client_socket(
      host_.c_str(), ip.c_str(), port_, address_family_, tcp_nodelay_,
      socket_options_, connection_timeout_sec_, connection_timeout_usec_,
      read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
      write_timeout_usec_, interface_, error);
}